

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_node_any(lyd_lyb_ctx *lybctx,lyd_node *parent,lysc_node *snode,lyd_node **first_p,
                         ly_set *parsed)

{
  ly_ctx *ctx_00;
  LY_ERR LVar1;
  LY_ERR ret__;
  ly_ctx *ctx;
  lyd_meta *plStack_78;
  uint32_t flags;
  char *value;
  lyd_ctx *lydctx;
  ly_in *in;
  lyd_meta *plStack_58;
  LYD_ANYDATA_VALUETYPE value_type;
  lyd_meta *meta;
  lyd_node *tree;
  lyd_node *node;
  ly_set *plStack_38;
  LY_ERR ret;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lysc_node *snode_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  tree = (lyd_node *)0x0;
  meta = (lyd_meta *)0x0;
  plStack_58 = (lyd_meta *)0x0;
  value = (char *)0x0;
  plStack_78 = (lyd_meta *)0x0;
  ctx_00 = lybctx->lybctx->ctx;
  plStack_38 = parsed;
  parsed_local = (ly_set *)first_p;
  first_p_local = (lyd_node **)snode;
  snode_local = (lysc_node *)parent;
  parent_local = (lyd_node *)lybctx;
  node._4_4_ = lyb_parse_node_header
                         (lybctx,snode,(uint32_t *)((long)&ctx + 4),&stack0xffffffffffffffa8);
  if (node._4_4_ == LY_SUCCESS) {
    lyb_read_number((void *)((long)&in + 4),4,4,(lylyb_ctx *)parent_local[0x4b].parent);
    if ((in._4_4_ == LYD_ANYDATA_DATATREE) ||
       ((*(short *)first_p_local == 0x60 && (in._4_4_ != LYD_ANYDATA_LYB)))) {
      ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c",
             0x4ca);
      node._4_4_ = LY_EINT;
    }
    else {
      node._4_4_ = lyb_read_string((char **)&stack0xffffffffffffff88,'\b',
                                   (lylyb_ctx *)parent_local[0x4b].parent);
      if (node._4_4_ == LY_SUCCESS) {
        LVar1 = LY_SUCCESS;
        if (in._4_4_ == LYD_ANYDATA_LYB) {
          LVar1 = ly_in_new_memory((char *)plStack_78,(ly_in **)&lydctx);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          node._4_4_ = lyd_parse_lyb(ctx_00,(lysc_ext_instance *)0x0,(lyd_node *)0x0,
                                     (lyd_node **)&meta,(ly_in *)lydctx,0x70000,0,0x30,(ly_set *)0x0
                                     ,(ly_bool *)0x0,(lyd_ctx **)&value);
          ly_in_free((ly_in *)lydctx,'\0');
          if (value != (char *)0x0) {
            (**(code **)(value + 0x1070))(value);
          }
          if (node._4_4_ != LY_SUCCESS) {
            lyd_free_siblings((lyd_node *)meta);
            goto LAB_00154fb3;
          }
          free(plStack_78);
          plStack_78 = meta;
          in._4_4_ = LYD_ANYDATA_DATATREE;
          LVar1 = node._4_4_;
        }
        node._4_4_ = LVar1;
        if (in._4_4_ < LYD_ANYDATA_LYB) {
          node._4_4_ = lyd_create_any((lysc_node *)first_p_local,plStack_78,in._4_4_,'\x01',&tree);
          if (node._4_4_ == LY_SUCCESS) {
            if (tree != (lyd_node *)0x0) {
              ly_log_location((lysc_node *)0x0,tree,(char *)0x0,(ly_in *)0x0);
              lyb_finish_node((lyd_lyb_ctx *)parent_local,(lyd_node *)snode_local,ctx._4_4_,
                              &stack0xffffffffffffffa8,&tree,(lyd_node **)parsed_local,plStack_38);
              ly_log_location_revert(0,1,0,0);
              return LY_SUCCESS;
            }
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                          ,0x4f4,
                          "LY_ERR lyb_parse_node_any(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                         );
          }
        }
        else {
          ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                 ,0x4ef);
          node._4_4_ = LY_EINT;
        }
      }
    }
  }
LAB_00154fb3:
  free(plStack_78);
  lyd_free_meta_siblings(plStack_58);
  lyd_free_tree(tree);
  return node._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_node_any(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, const struct lysc_node *snode,
        struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR ret;
    struct lyd_node *node = NULL, *tree = NULL;
    struct lyd_meta *meta = NULL;
    LYD_ANYDATA_VALUETYPE value_type;
    struct ly_in *in;
    struct lyd_ctx *lydctx = NULL;
    char *value = NULL;
    uint32_t flags;
    const struct ly_ctx *ctx = lybctx->lybctx->ctx;

    /* read necessary basic data */
    ret = lyb_parse_node_header(lybctx, snode, &flags, &meta);
    LY_CHECK_GOTO(ret, error);

    /* parse value type */
    lyb_read_number(&value_type, sizeof value_type, sizeof value_type, lybctx->lybctx);
    if ((value_type == LYD_ANYDATA_DATATREE) || ((snode->nodetype == LYS_ANYDATA) && (value_type != LYD_ANYDATA_LYB))) {
        LOGINT(ctx);
        ret = LY_EINT;
        goto error;
    }

    /* read anydata content */
    ret = lyb_read_string(&value, sizeof(uint64_t), lybctx->lybctx);
    LY_CHECK_GOTO(ret, error);

    if (value_type == LYD_ANYDATA_LYB) {
        /* parse LYB into a data tree */
        LY_CHECK_RET(ly_in_new_memory(value, &in));
        ret = lyd_parse_lyb(ctx, NULL, NULL, &tree, in, LYD_PARSE_ONLY | LYD_PARSE_OPAQ | LYD_PARSE_STRICT, 0,
                LYD_INTOPT_ANY | LYD_INTOPT_WITH_SIBLINGS, NULL, NULL, &lydctx);
        ly_in_free(in, 0);
        if (lydctx) {
            lydctx->free(lydctx);
        }
        LY_CHECK_ERR_GOTO(ret, lyd_free_siblings(tree), error);

        /* use the parsed tree as the value */
        free(value);
        value = (char *)tree;
        value_type = LYD_ANYDATA_DATATREE;
    }

    /* create the node */
    switch (value_type) {
    case LYD_ANYDATA_DATATREE:
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_XML:
    case LYD_ANYDATA_JSON:
        /* use the value directly */
        ret = lyd_create_any(snode, value, value_type, 1, &node);
        LY_CHECK_GOTO(ret, error);
        break;
    default:
        LOGINT(ctx);
        ret = LY_EINT;
        goto error;
    }

    assert(node);
    LOG_LOCSET(NULL, node);

    /* register parsed anydata node */
    lyb_finish_node(lybctx, parent, flags, &meta, &node, first_p, parsed);

    LOG_LOCBACK(0, 1);
    return LY_SUCCESS;

error:
    free(value);
    lyd_free_meta_siblings(meta);
    lyd_free_tree(node);
    return ret;
}